

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

int libj1939_set_broadcast(int sock)

{
  int iVar1;
  int iVar2;
  int broadcast;
  undefined4 local_10;
  int local_c;
  
  local_10 = 1;
  iVar1 = setsockopt(sock,1,6,&local_10,4);
  iVar2 = 0;
  if (iVar1 < 0) {
    libj1939_set_broadcast_cold_1();
    iVar2 = local_c;
  }
  return iVar2;
}

Assistant:

int libj1939_set_broadcast(int sock)
{
	int broadcast = true;
	int ret;

	ret = setsockopt(sock, SOL_SOCKET, SO_BROADCAST, &broadcast,
			 sizeof(broadcast));
	if (ret < 0) {
		ret = -errno;
		pr_err("setsockopt(SO_BROADCAST): %d (%s)", ret, strerror(ret));
		return ret;
	}

	return 0;
}